

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic2::Run(UnitTest_semantic2 *this)

{
  Terminator *pTVar1;
  UnitTestBase *in_RDI;
  Terminator *b;
  Terminator *a;
  Terminator *f;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  string *in_stack_fffffffffffffdf8;
  allocator *paVar2;
  FindName *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe38;
  allocator *error;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffe50;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [64];
  Terminator *local_f0;
  allocator local_e1;
  string local_e0 [64];
  Terminator *local_a0;
  allocator local_91;
  string local_90 [64];
  Terminator *local_50;
  allocator local_31;
  string local_30 [48];
  
  paVar2 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"f(a, b)",paVar2);
  anon_unknown.dwarf_fc1b::Semantic(in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  error = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"f",error);
  FindName::FindName(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  pTVar1 = ASTFind<luna::Terminator,FindName>(in_stack_fffffffffffffe50,(FindName *)paVar2);
  FindName::~FindName((FindName *)0x1a3977);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_50 = pTVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"a",&local_e1);
  FindName::FindName(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  pTVar1 = ASTFind<luna::Terminator,FindName>(in_stack_fffffffffffffe50,(FindName *)paVar2);
  FindName::~FindName((FindName *)0x1a3a0b);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  local_a0 = pTVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"b",&local_131);
  FindName::FindName(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  pTVar1 = ASTFind<luna::Terminator,FindName>(in_stack_fffffffffffffe50,(FindName *)paVar2);
  FindName::~FindName((FindName *)0x1a3a9f);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_f0 = pTVar1;
  if (local_50->semantic_ != SemanticOp_Read) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"\'f->semantic_ == luna::SemanticOp_Read\'",&local_159);
    UnitTestBase::Error(in_RDI,(string *)error);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  if (local_a0->semantic_ != SemanticOp_Read) {
    paVar2 = &local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"\'a->semantic_ == luna::SemanticOp_Read\'",paVar2);
    UnitTestBase::Error(in_RDI,(string *)error);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  if (local_f0->semantic_ != SemanticOp_Read) {
    paVar2 = (allocator *)&stack0xfffffffffffffe57;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"\'b->semantic_ == luna::SemanticOp_Read\'",paVar2);
    UnitTestBase::Error(in_RDI,(string *)error);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe57);
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pTVar1);
  return;
}

Assistant:

TEST_CASE(semantic2)
{
    auto ast = Semantic("f(a, b)");
    auto f = ASTFind<luna::Terminator>(ast, FindName("f"));
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto b = ASTFind<luna::Terminator>(ast, FindName("b"));
    EXPECT_TRUE(f->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(b->semantic_ == luna::SemanticOp_Read);
}